

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint32_t cpu_rddsp_mips(uint32_t mask_num,CPUMIPSState_conflict *env)

{
  uint uVar1;
  uint local_2c;
  target_ulong_conflict dsp;
  target_ulong_conflict temp;
  uint32_t i;
  uint32_t ruler;
  uint8_t mask [6];
  CPUMIPSState_conflict *env_local;
  uint32_t mask_num_local;
  
  temp = 1;
  for (dsp = 0; dsp < 6; dsp = dsp + 1) {
    *(char *)((long)&i + (ulong)dsp + 2) = (char)((mask_num & temp) >> ((byte)dsp & 0x1f));
    temp = temp << 1;
  }
  local_2c = 0;
  uVar1 = (env->active_tc).DSPControl;
  if (i._2_1_ == '\x01') {
    local_2c = uVar1 & 0x3f;
  }
  if (i._3_1_ == '\x01') {
    local_2c = uVar1 & 0x1f80 | local_2c;
  }
  if ((char)ruler == '\x01') {
    local_2c = uVar1 & 0x2000 | local_2c;
  }
  if (ruler._1_1_ == '\x01') {
    local_2c = uVar1 & 0xff0000 | local_2c;
  }
  if (ruler._2_1_ == '\x01') {
    local_2c = uVar1 & 0xf000000 | local_2c;
  }
  if (ruler._3_1_ == '\x01') {
    local_2c = uVar1 & 0x4000 | local_2c;
  }
  return local_2c;
}

Assistant:

uint32_t cpu_rddsp(uint32_t mask_num, CPUMIPSState *env)
{
    uint8_t  mask[6];
    uint32_t ruler, i;
    target_ulong temp;
    target_ulong dsp;

    ruler = 0x01;
    for (i = 0; i < 6; i++) {
        mask[i] = (mask_num & ruler) >> i ;
        ruler = ruler << 1;
    }

    temp  = 0x00;
    dsp = env->active_tc.DSPControl;

    if (mask[0] == 1) {
#if defined(TARGET_MIPS64)
        temp |= dsp & 0x7F;
#else
        temp |= dsp & 0x3F;
#endif
    }

    if (mask[1] == 1) {
        temp |= dsp & 0x1F80;
    }

    if (mask[2] == 1) {
        temp |= dsp & 0x2000;
    }

    if (mask[3] == 1) {
        temp |= dsp & 0x00FF0000;
    }

    if (mask[4] == 1) {
#if defined(TARGET_MIPS64)
        temp |= dsp & 0xFF000000;
#else
        temp |= dsp & 0x0F000000;
#endif
    }

    if (mask[5] == 1) {
        temp |= dsp & 0x4000;
    }

    return temp;
}